

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.h
# Opt level: O3

int __thiscall Sequence::get_file_l2(Sequence *this)

{
  long *plVar1;
  element_type *peVar2;
  int l2cnt;
  int local_c;
  
  local_c = 0;
  peVar2 = (this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (1 < peVar2->max_iset_len) {
    InvertDatabase::get_l2file
              ((this->invdb).super___shared_ptr<InvertDatabase,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &peVar2->it2f,'\0',&local_c);
    peVar2 = (this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if (1 < peVar2->max_seq_len) {
    InvertDatabase::get_l2file
              ((this->invdb).super___shared_ptr<InvertDatabase,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &peVar2->seqf,'\x01',&local_c);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"L2 : ",5);
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cerr,local_c);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  return local_c;
}

Assistant:

int get_file_l2() {
        int l2cnt = 0;

        if (args->max_iset_len > 1) {
            invdb->get_l2file(args->it2f, 0, l2cnt);
        }
        if (args->max_seq_len > 1) {
            invdb->get_l2file(args->seqf, 1, l2cnt);
        }

        cerr << "L2 : " << l2cnt << endl;
        return l2cnt;
    }